

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void __thiscall
dlib::cpu::pooling::setup_max_pooling
          (pooling *this,int window_height_,int window_width_,int stride_y_,int stride_x_,
          int padding_y_,int padding_x_)

{
  ostream *poVar1;
  fatal_error *pfVar2;
  ostringstream dlib_o_out;
  string local_1b0;
  undefined1 local_190 [376];
  
  if (window_width_ < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"\n\nError detected at line ",0x19);
    poVar1 = (ostream *)std::ostream::operator<<(local_190,0x649);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)",0x48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"window_width_ > 0",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
         *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    pfVar2 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar2,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar2,&fatal_error::typeinfo,error::~error);
  }
  if (window_height_ < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"\n\nError detected at line ",0x19);
    poVar1 = (ostream *)std::ostream::operator<<(local_190,0x64a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)",0x48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"window_height_ > 0",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
         *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    pfVar2 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar2,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar2,&fatal_error::typeinfo,error::~error);
  }
  if (stride_y_ < 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"\n\nError detected at line ",0x19);
    poVar1 = (ostream *)std::ostream::operator<<(local_190,0x64b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)",0x48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"stride_y_ > 0",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
         *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    pfVar2 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar2,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar2,&fatal_error::typeinfo,error::~error);
  }
  if (0 < stride_x_) {
    if ((uint)window_height_ <= (uint)padding_y_) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"\n\nError detected at line ",0x19);
      poVar1 = (ostream *)std::ostream::operator<<(local_190,0x64d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)",0x48);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"0 <= padding_y_ && padding_y_ < window_height_",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
      *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
           *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
      pfVar2 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar2,EBROKEN_ASSERT,&local_1b0);
      __cxa_throw(pfVar2,&fatal_error::typeinfo,error::~error);
    }
    if ((uint)padding_x_ < (uint)window_width_) {
      this->window_height = window_height_;
      this->window_width = window_width_;
      this->stride_y = stride_y_;
      this->stride_x = stride_x_;
      this->padding_y = padding_y_;
      this->padding_x = padding_x_;
      this->do_max_pooling = true;
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"\n\nError detected at line ",0x19);
    poVar1 = (ostream *)std::ostream::operator<<(local_190,0x64e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)",0x48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"0 <= padding_x_ && padding_x_ < window_width_",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
         *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    pfVar2 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar2,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar2,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,0x64c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)",0x48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"stride_x_ > 0",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
       *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  pfVar2 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar2,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(pfVar2,&fatal_error::typeinfo,error::~error);
}

Assistant:

void pooling::
        setup_max_pooling(
            int window_height_,
            int window_width_,
            int stride_y_,
            int stride_x_,
            int padding_y_,
            int padding_x_
        )
        {
            DLIB_CASSERT(window_width_ > 0);
            DLIB_CASSERT(window_height_ > 0);
            DLIB_CASSERT(stride_y_ > 0);
            DLIB_CASSERT(stride_x_ > 0);
            DLIB_CASSERT(0 <= padding_y_ && padding_y_ < window_height_);
            DLIB_CASSERT(0 <= padding_x_ && padding_x_ < window_width_);

            window_height = window_height_;
            window_width = window_width_;
            stride_y = stride_y_;
            stride_x = stride_x_;
            padding_y = padding_y_;
            padding_x = padding_x_;
            do_max_pooling = true;
        }